

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_phi2::llm_build_phi2
          (llm_build_phi2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  uint32_t uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  pointer plVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  float fVar14;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *ffn_output;
  ggml_tensor *attn_norm_output;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd38;
  int iVar15;
  llama_hparams *in_stack_fffffffffffffd40;
  ggml_tensor *in_stack_fffffffffffffd48;
  ggml_tensor *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd58;
  llm_graph_context *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  llm_graph_context *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  ggml_tensor *pgVar16;
  llm_graph_context *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *pgVar17;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffe48;
  llm_graph_context *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_ffffffffffffff00;
  ggml_tensor *in_stack_ffffffffffffff08;
  ggml_tensor *in_stack_ffffffffffffff10;
  ggml_tensor *in_stack_ffffffffffffff18;
  ggml_tensor *this_00;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t uVar18;
  ggml_tensor *in_stack_ffffffffffffff60;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  ggml_tensor *local_68;
  ggml_tensor *local_58;
  ggml_tensor *local_50;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd50,
             (llm_graph_params *)in_stack_fffffffffffffd48);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  uVar2 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffd40,(uint32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20))
  ;
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1b54,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  uVar18 = uVar2;
  local_68 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pgVar11 = local_68;
  pgVar3 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffda0);
  pgVar13 = pgVar3;
  pgVar4 = (ggml_tensor *)llm_graph_context::build_attn_inp_kv_unified(in_stack_fffffffffffffde0);
  for (local_7c = 0; iVar15 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
      (long)local_7c < in_RDI->ne[3]; local_7c = local_7c + 1) {
    pgVar16 = local_68;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    pgVar10 = pvVar5->attn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_7c
              );
    local_58 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                          (int)in_stack_fffffffffffffd40);
    this_00 = local_58;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    if (pvVar5->wqkv == (ggml_tensor *)0x0) {
      pgVar17 = in_RDI->src[5];
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_7c);
      pgVar6 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          in_stack_fffffffffffffd90);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_7c);
      local_88 = ggml_add(pgVar17,pgVar6,pvVar5->bq);
      pgVar17 = in_RDI->src[5];
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_7c);
      pgVar6 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          in_stack_fffffffffffffd90);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_7c);
      local_90 = ggml_add(pgVar17,pgVar6,pvVar5->bk);
      pgVar17 = in_RDI->src[5];
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_7c);
      pgVar6 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                          in_stack_fffffffffffffd90);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_7c);
      local_98 = ggml_add(pgVar17,pgVar6,pvVar5->bv);
    }
    else {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_7c);
      in_stack_ffffffffffffff08 =
           llm_graph_context::build_lora_mm
                     (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90)
      ;
      in_stack_ffffffffffffff18 = in_stack_ffffffffffffff08;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 &in_stack_fffffffffffffd40->vocab_only,iVar15);
      in_stack_ffffffffffffff00 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_7c);
      pgVar6 = (ggml_tensor *)
               ggml_add(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,pvVar5->bqkv);
      in_stack_ffffffffffffff10 = pgVar6;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 &in_stack_fffffffffffffd40->vocab_only,iVar15);
      pgVar17 = in_RDI->src[5];
      uVar7 = ggml_view_2d(pgVar17,pgVar6,in_RDI->ne[2],(long)*(int *)(in_RDI->src + 2),
                           pgVar6->nb[1],0);
      local_88 = ggml_cont(pgVar17,uVar7);
      pgVar17 = in_RDI->src[5];
      uVar7 = ggml_view_2d(pgVar17,pgVar6,uVar2,(long)*(int *)(in_RDI->src + 2),pgVar6->nb[1],
                           in_RDI->ne[2] << 2);
      local_90 = ggml_cont(pgVar17,uVar7);
      pgVar17 = in_RDI->src[5];
      uVar7 = ggml_view_2d();
      local_98 = ggml_cont(pgVar17,uVar7);
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    uVar8 = ggml_reshape_3d(in_RDI->src[5],local_88,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar7._0_4_ = in_RDI->op;
    uVar7._4_4_ = in_RDI->op_params[0];
    uVar7 = ggml_reshape_3d(in_RDI->src[5],local_90,uVar1,uVar7,(long)*(int *)(in_RDI->src + 2));
    uVar9._0_4_ = in_RDI->op;
    uVar9._4_4_ = in_RDI->op_params[0];
    ggml_reshape_3d(in_RDI->src[5],local_98,uVar1,uVar9,(long)*(int *)(in_RDI->src + 2));
    uVar9 = ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                          in_RDI->flags,*(undefined4 *)in_RDI->src,
                          *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar8,pgVar3,0,
                          (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar7,pgVar3,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,iVar15);
    pgVar17 = in_RDI->src[5];
    fVar14 = sqrtf((float)uVar1);
    ggml_scale(1.0 / fVar14,pgVar17,uVar9);
    iVar15 = (int)pgVar17;
    pgVar17 = pgVar4;
    pgVar6 = in_RCX;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    type_op = (llm_ffn_op_type)pvVar5->wo;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_7c
              );
    local_50 = llm_graph_context::build_attn
                         ((llm_graph_context *)this_00,(llm_graph_input_attn_kv_unified *)pgVar10,
                          (ggml_cgraph *)pgVar16,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                          ,in_stack_ffffffffffffff08,pgVar13,pgVar11,in_RDI,
                          (ggml_tensor *)CONCAT44(uVar18,in_stack_ffffffffffffff58),
                          (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                          (int)in_stack_ffffffffffffff60);
    pgVar10 = local_50;
    if ((long)local_7c == in_RDI->ne[3] + -1) {
      in_stack_fffffffffffffe08 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd90);
      in_stack_ffffffffffffff60 = in_stack_fffffffffffffe08;
      local_50 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe00 = local_50;
      local_68 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_68,in_stack_ffffffffffffff60);
      in_stack_fffffffffffffdf8 = local_68;
      in_stack_fffffffffffffdf0 =
           (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_58,in_stack_ffffffffffffff60);
      local_58 = in_stack_fffffffffffffdf0;
    }
    type_gate = (llm_ffn_gate_type)pgVar10;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    pgVar10 = pvVar5->ffn_up;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    pgVar16 = pvVar5->ffn_up_b;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    in_stack_fffffffffffffd48 = pvVar5->ffn_down;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_7c);
    in_stack_fffffffffffffd50 = pvVar5->ffn_down_b;
    in_stack_fffffffffffffd60 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd58 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd40 = (llama_hparams *)0x0;
    in_stack_fffffffffffffd38 = (ggml_tensor *)0x0;
    pgVar10 = llm_graph_context::build_ffn
                        ((llm_graph_context *)&stack0xfffffffffffffd38,pgVar16,pgVar10,local_58,
                         in_stack_fffffffffffffd48,in_stack_fffffffffffffdb8,
                         in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,pgVar17,pgVar6,type_op,
                         type_gate,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    in_stack_fffffffffffffdb8 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_50,pgVar10);
    ggml_add(in_RDI->src[5],in_stack_fffffffffffffdb8,local_68);
    local_68 = llm_graph_context::build_cvec
                         ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,0
                         );
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               &in_stack_fffffffffffffd40->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  }
  pgVar11 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
                       ,in_stack_fffffffffffffd48,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                       (int)in_stack_fffffffffffffd40);
  pgVar13 = pgVar11;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             &in_stack_fffffffffffffd40->vocab_only,iVar15);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d28cb);
  plVar12->t_embd = pgVar11;
  pgVar13 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)pgVar13,in_stack_fffffffffffffd98,pgVar11);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             &in_stack_fffffffffffffd40->vocab_only,iVar15);
  pgVar13 = (ggml_tensor *)ggml_add(in_RDI->src[5],pgVar13,*(undefined8 *)(in_RSI + 0x19a0));
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             &in_stack_fffffffffffffd40->vocab_only,iVar15);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d29b2);
  plVar12->t_logits = pgVar13;
  ggml_build_forward_expand(in_RCX,pgVar13);
  return;
}

Assistant:

llm_build_phi2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * attn_norm_output;
        ggml_tensor * ffn_output;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            attn_norm_output = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(attn_norm_output, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv) {
                    cur = build_lora_mm(model.layers[il].wqkv, attn_norm_output);
                    cb(cur, "wqkv", il);

                    cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                    cb(cur, "bqkv", il);

                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));
                } else {
                    Qcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wq, attn_norm_output), model.layers[il].bq);
                    Kcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wk, attn_norm_output), model.layers[il].bk);
                    Vcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wv, attn_norm_output), model.layers[il].bv);
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                // with phi2, we scale the Q to avoid precision issues
                // ref: https://github.com/ml-explore/mlx-examples/blob/08e862336ade809bc37d1035f94b359e7d1a5152/phi2/phi2.py#L64-L66
                Qcur = ggml_scale(ctx0, Qcur, 1.0f/sqrtf(float(n_embd_head)));

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur              = ggml_get_rows(ctx0,              cur, inp_out_ids);
                inpL             = ggml_get_rows(ctx0,             inpL, inp_out_ids);
                attn_norm_output = ggml_get_rows(ctx0, attn_norm_output, inp_out_ids);
            }

            // FF
            {
                ffn_output = build_ffn(attn_norm_output,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(ffn_output, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_output);
            cur = ggml_add(ctx0, cur, inpL);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);
        cb(cur, "result_output_no_bias", -1);

        cur = ggml_add(ctx0, cur, model.output_b);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }